

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<double>::Subst_Backward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double **ppdVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  long local_58;
  
  lVar13 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if ((lVar13 != CONCAT44(extraout_var,iVar4)) ||
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
  }
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  lVar13 = CONCAT44(extraout_var_00,iVar4);
  if (lVar13 != 0) {
    if (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) {
      lVar7 = 1;
      if (lVar13 < 1) {
        lVar7 = lVar13;
      }
      lVar12 = 0;
      local_58 = 0;
      lVar11 = lVar13;
LAB_00cc2a87:
      do {
        lVar5 = lVar7;
        lVar10 = lVar7 + -1;
        if (1 < lVar11) {
          if (((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < lVar11) ||
             ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_58)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar14 = *(double *)
                    ((long)B->fElem +
                    lVar11 * 8 + (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar12 + -8
                    );
          lVar10 = lVar11 + -1;
          lVar5 = lVar11;
          if ((dVar14 == 0.0) && (lVar11 = lVar10, !NAN(dVar14))) goto LAB_00cc2a87;
        }
        if (1 < lVar5) {
          lVar11 = lVar10 * 8;
          do {
            lVar11 = lVar11 + -8;
            ppdVar1 = (this->fElem).fStore;
            pdVar9 = ppdVar1[lVar10];
            pdVar2 = ppdVar1[lVar10 + 1];
            if (((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10) ||
               ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_58)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            pdVar6 = B->fElem;
            lVar8 = lVar5 * local_58;
            dVar14 = pdVar6[lVar8 + lVar10] / *pdVar9;
            pdVar6[lVar8 + lVar10] = dVar14;
            pdVar9 = pdVar9 + 1;
            if (pdVar9 < pdVar2) {
              pdVar6 = (double *)((long)pdVar6 + lVar5 * lVar12 + lVar11);
              do {
                *pdVar6 = *pdVar6 - *pdVar9 * dVar14;
                pdVar9 = pdVar9 + 1;
                pdVar6 = pdVar6 + -1;
              } while (pdVar9 < pdVar2);
            }
            bVar3 = 1 < lVar10;
            lVar10 = lVar10 + -1;
          } while (bVar3);
        }
        local_58 = local_58 + 1;
        lVar12 = lVar12 + 8;
        lVar11 = lVar13;
      } while (local_58 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
    }
    if (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) {
      lVar13 = 0;
      do {
        if ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar13;
        B->fElem[lVar7] = B->fElem[lVar7] / **(this->fElem).fStore;
        lVar13 = lVar13 + 1;
      } while (lVar13 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}